

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dos_blocker.cpp
# Opt level: O0

bool __thiscall
libtorrent::dht::dos_blocker::incoming
          (dos_blocker *this,address *addr,time_point now,dht_logger *logger)

{
  node_ban_entry *pnVar1;
  bool bVar2;
  undefined8 uVar3;
  ulong uVar4;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar5;
  undefined1 auVar6 [16];
  int local_d4;
  duration<long,_std::ratio<1L,_1L>_> local_d0;
  duration local_c8;
  int local_bc;
  duration<long,_std::ratio<1L,_1L>_> local_b8 [2];
  duration<long,_std::ratio<1L,_1L>_> local_a8 [2];
  int local_94;
  duration<long,_std::ratio<1L,_1L>_> local_90 [3];
  duration<long,_std::ratio<1L,_1000000000L>_> local_78;
  rep local_70;
  string local_68;
  dos_blocker *local_48;
  node_ban_entry *i;
  node_ban_entry *min;
  node_ban_entry *match;
  dht_logger *logger_local;
  address *addr_local;
  dos_blocker *this_local;
  time_point now_local;
  
  min = (node_ban_entry *)0x0;
  i = this->m_ban_nodes;
  local_48 = (dos_blocker *)this->m_ban_nodes;
  match = (node_ban_entry *)logger;
  logger_local = (dht_logger *)addr;
  addr_local = (address *)this;
  this_local = (dos_blocker *)now.__d.__r;
  do {
    if (this + 1 <= local_48) {
LAB_006a278b:
      if (min == (node_ban_entry *)0x0) {
        i->count = 1;
        local_d4 = 10;
        std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1l>> *)&local_d0,&local_d4);
        local_c8.__r = (rep)std::chrono::operator+
                                      ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                        *)&this_local,&local_d0);
        (i->limit).__d.__r = local_c8.__r;
        boost::asio::ip::address::operator=(&i->src,(address *)logger_local);
      }
      else {
        min->count = min->count + 1;
        if (SBORROW4(min->count,this->m_message_rate_limit * 10) ==
            min->count + this->m_message_rate_limit * -10 < 0) {
          bVar2 = std::chrono::operator<
                            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)&this_local,&min->limit);
          if (bVar2) {
            if (min->count == this->m_message_rate_limit * 10) {
              if (match != (node_ban_entry *)0x0) {
                auVar6 = (*(code *)**(undefined8 **)&match->src)(match,0);
                pnVar1 = match;
                if ((auVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  print_address_abi_cxx11_(&local_68,(libtorrent *)logger_local,auVar6._8_8_);
                  uVar3 = std::__cxx11::string::c_str();
                  local_78.__r = (rep)std::chrono::operator-
                                                ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                                  *)&this_local,&min->limit);
                  local_94 = 10;
                  std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                            ((duration<long,std::ratio<1l,1l>> *)local_90,&local_94);
                  local_70 = (rep)std::chrono::operator+(&local_78,local_90);
                  uVar4 = total_milliseconds<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                                    ((duration<long,_std::ratio<1L,_1000000000L>_>)local_70);
                  (**(code **)(*(long *)&pnVar1->src + 8))
                            (pnVar1,0,"BANNING PEER [ ip: %s time: %d ms count: %d ]",uVar3,
                             uVar4 & 0xffffffff,min->count);
                  std::__cxx11::string::~string((string *)&local_68);
                }
              }
              std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                        ((duration<long,std::ratio<1l,1l>> *)local_a8,&this->m_block_timeout);
              tVar5 = std::chrono::operator+
                                ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&this_local,local_a8);
              (min->limit).__d.__r = (rep)tVar5.__d.__r;
            }
            return false;
          }
          min->count = 0;
          local_bc = 10;
          std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
                    ((duration<long,std::ratio<1l,1l>> *)local_b8,&local_bc);
          tVar5 = std::chrono::operator+
                            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)&this_local,local_b8);
          (min->limit).__d.__r = (rep)tVar5.__d.__r;
        }
      }
      return true;
    }
    bVar2 = boost::asio::ip::operator==((address *)local_48,(address *)logger_local);
    if (bVar2) {
      min = (node_ban_entry *)local_48;
      goto LAB_006a278b;
    }
    if ((int)local_48->m_ban_nodes[0].limit.__d.__r < i->count) {
      i = (node_ban_entry *)local_48;
    }
    else if (((int)local_48->m_ban_nodes[0].limit.__d.__r == i->count) &&
            (bVar2 = std::chrono::operator<
                               ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 *)&local_48->m_ban_nodes[0].src.ipv6_address_.scope_id_,&i->limit),
            bVar2)) {
      i = (node_ban_entry *)local_48;
    }
    local_48 = (dos_blocker *)&local_48->m_ban_nodes[0].count;
  } while( true );
}

Assistant:

bool dos_blocker::incoming(address const& addr, time_point const now, dht_logger* logger)
	{
		TORRENT_UNUSED(logger);
		node_ban_entry* match = nullptr;
		node_ban_entry* min = m_ban_nodes;
		for (node_ban_entry* i = m_ban_nodes; i < m_ban_nodes + num_ban_nodes; ++i)
		{
			if (i->src == addr)
			{
				match = i;
				break;
			}
			if (i->count < min->count) min = i;
			else if (i->count == min->count
				&& i->limit < min->limit) min = i;
		}

		if (match)
		{
			++match->count;

			if (match->count >= m_message_rate_limit * 10)
			{
				if (now < match->limit)
				{
					if (match->count == m_message_rate_limit * 10)
					{
#ifndef TORRENT_DISABLE_LOGGING
						if (logger != nullptr && logger->should_log(dht_logger::tracker))
						{
							logger->log(dht_logger::tracker, "BANNING PEER [ ip: %s time: %d ms count: %d ]"
								, print_address(addr).c_str()
								, int(total_milliseconds((now - match->limit) + seconds(10)))
								, match->count);
						}
#else
						TORRENT_UNUSED(logger);
#endif // TORRENT_DISABLE_LOGGING
						// we've received too many messages in less than 10 seconds
						// from this node. Ignore it until it's silent for 5 minutes
						match->limit = now + seconds(m_block_timeout);
					}

					return false;
				}

				// the messages we received from this peer took more than 10
				// seconds. Reset the counter and the timer
				match->count = 0;
				match->limit = now + seconds(10);
			}
		}
		else
		{
			min->count = 1;
			min->limit = now + seconds(10);
			min->src = addr;
		}
		return true;
	}